

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ini.hpp
# Opt level: O0

vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *
CLI::detail::parse_ini
          (vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>
           *__return_storage_ptr__,string *name)

{
  byte bVar1;
  FileError *__return_storage_ptr___00;
  string local_250;
  istream local_220 [8];
  ifstream input;
  string *name_local;
  
  ::std::ifstream::ifstream(local_220,name,8);
  bVar1 = ::std::ios::good();
  if ((bVar1 & 1) == 0) {
    __return_storage_ptr___00 = (FileError *)__cxa_allocate_exception(0x38);
    ::std::__cxx11::string::string((string *)&local_250,(string *)name);
    FileError::Missing(__return_storage_ptr___00,&local_250);
    __cxa_throw(__return_storage_ptr___00,&FileError::typeinfo,FileError::~FileError);
  }
  parse_ini(__return_storage_ptr__,local_220);
  ::std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<ini_ret_t> parse_ini(const std::string &name) {

    std::ifstream input{name};
    if(!input.good())
        throw FileError::Missing(name);

    return parse_ini(input);
}